

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::ShurComplementProduct
          (ChSystemDescriptor *this,ChVectorDynamic<> *result,ChVectorDynamic<> *lvector,
          vector<bool,_std::allocator<bool>_> *enabled)

{
  pointer ppCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  ChVariables *this_00;
  int iVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  ChConstraint *pCVar8;
  size_t ic;
  long lVar9;
  size_type __n;
  size_t iv;
  long lVar10;
  double in_XMM0_Qa;
  reference rVar11;
  DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_48 [24];
  
  if ((this->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->vstiffness).super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("vstiffness.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x1e8,
                  "virtual void chrono::ChSystemDescriptor::ShurComplementProduct(ChVectorDynamic<> &, const ChVectorDynamic<> &, std::vector<bool> *)"
                 );
  }
  lVar10 = (lvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  iVar5 = (*this->_vptr_ChSystemDescriptor[8])();
  if (lVar10 != iVar5) {
    __assert_fail("lvector.size() == CountActiveConstraints()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                  ,0x1e9,
                  "virtual void chrono::ChSystemDescriptor::ShurComplementProduct(ChVectorDynamic<> &, const ChVectorDynamic<> &, std::vector<bool> *)"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)this->n_c
            );
  ppCVar1 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar10 = 0; (long)ppCVar1 - (long)ppCVar3 >> 3 != lVar10; lVar10 = lVar10 + 1) {
    this_00 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar10];
    if (this_00->disabled == false) {
      ChVariables::Get_qb((ChVectorRef *)local_48,this_00);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero(local_48);
    }
  }
  lVar10 = (long)ppCVar2 - (long)ppCVar4 >> 3;
  for (lVar9 = 0; lVar10 != lVar9; lVar9 = lVar9 + 1) {
    pCVar8 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar9];
    if (pCVar8->active == true) {
      __n = (size_type)pCVar8->offset;
      if (enabled != (vector<bool,_std::allocator<bool>_> *)0x0) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](enabled,__n);
        if ((*rVar11._M_p & rVar11._M_mask) == 0) goto LAB_00cf0fa6;
      }
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)lvector,__n)
      ;
      in_XMM0_Qa = *pdVar6;
      (*(this->vconstraints).
        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar9]->_vptr_ChConstraint[8])();
      in_XMM0_Qa = in_XMM0_Qa *
                   (this->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9]->cfm_i;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)result,__n);
      *pSVar7 = in_XMM0_Qa;
    }
LAB_00cf0fa6:
  }
  lVar9 = 0;
  do {
    if (lVar10 == lVar9) {
      return;
    }
    pCVar8 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar9];
    if (pCVar8->active == true) {
      if (enabled != (vector<bool,_std::allocator<bool>_> *)0x0) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](enabled,(long)pCVar8->offset);
        pCVar8 = (this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9];
        if ((*rVar11._M_p & rVar11._M_mask) == 0) {
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)result,
                              (long)pCVar8->offset);
          *pSVar7 = 0.0;
          goto LAB_00cf1022;
        }
      }
      (*pCVar8->_vptr_ChConstraint[7])();
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)result,
                          (long)(this->vconstraints).
                                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar9]->offset);
      in_XMM0_Qa = in_XMM0_Qa + *pSVar7;
      *pSVar7 = in_XMM0_Qa;
    }
LAB_00cf1022:
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void ChSystemDescriptor::ShurComplementProduct(ChVectorDynamic<>& result,
                                               const ChVectorDynamic<>& lvector,
                                               std::vector<bool>* enabled) {
    // currently, the case with ChKblock items is not supported (only diagonal M is supported, no K)
    assert(vstiffness.size() == 0);
    assert(lvector.size() == CountActiveConstraints());

    result.setZero(n_c);

    // Performs the sparse product    result = [N]*l = [ [Cq][M^(-1)][Cq'] - [E] ] *l
    // in different phases:

    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();

    // 1 - set the qb vector (aka speeds, in each ChVariable sparse data) as zero

    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive())
            vvariables[iv]->Get_qb().setZero();
    }

    // 2 - performs    qb=[M^(-1)][Cq']*l  by
    //     iterating over all constraints (when implemented in parallel this
    //     could be non-trivial because race conditions might occur -> reduction buffer etc.)
    //     Also, begin to add the cfm term ( -[E]*l ) to the result.

    // ATTENTION:  this loop cannot be parallelized! Concurrent write to some q may happen
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            int s_c = vconstraints[ic]->GetOffset();

            bool process = (!enabled) || (*enabled)[s_c];

            if (process) {
                double li = lvector(s_c);

                // Compute qb += [M^(-1)][Cq']*l_i
                //  NOTE! concurrent update to same q data, risk of collision if parallel.
                vconstraints[ic]->Increment_q(li);  // computationally intensive

                // Add constraint force mixing term  result = cfm * l_i = [E]*l_i
                result(s_c) = vconstraints[ic]->Get_cfm_i() * li;
            }
        }
    }

    // 3 - performs    result=[Cq']*qb    by
    //     iterating over all constraints

    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            bool process = (!enabled) || (*enabled)[vconstraints[ic]->GetOffset()];

            if (process)
                result(vconstraints[ic]->GetOffset()) += vconstraints[ic]->Compute_Cq_q();  // computationally intensive
            else
                result(vconstraints[ic]->GetOffset()) = 0;  // not enabled constraints, just set to 0 result
        }
    }
}